

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  pointer pPVar2;
  bool bVar3;
  bool bVar4;
  ArrayIndex AVar5;
  PathArgument *arg;
  pointer key;
  
  pPVar2 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (key = (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_start; bVar4 = key == pPVar2, !bVar4; key = key + 1) {
    bVar3 = true;
    if (key->kind_ == kindKey) {
      if (*(char *)&root->bits_ == '\a') {
        root = Value::operator[](root,&key->key_);
        Value::nullSingleton();
        if (root == &Value::nullSingleton::nullStatic) {
          Value::Value(__return_storage_ptr__,defaultValue);
          bVar3 = false;
          root = &Value::nullSingleton::nullStatic;
        }
      }
      else {
LAB_00112acb:
        Value::Value(__return_storage_ptr__,defaultValue);
        bVar3 = false;
      }
    }
    else if (key->kind_ == kindIndex) {
      if ((*(char *)&root->bits_ != '\x06') ||
         (uVar1 = key->index_, AVar5 = Value::size(root), AVar5 <= uVar1)) goto LAB_00112acb;
      root = Value::operator[](root,key->index_);
    }
    if (!bVar3) break;
  }
  if (bVar4) {
    Value::Value(__return_storage_ptr__,root);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}